

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O0

void __thiscall QWhatsThat::mouseReleaseEvent(QWhatsThat *this,QMouseEvent *e)

{
  bool bVar1;
  MouseButton MVar2;
  QPointF *this_00;
  QWidget *pQVar3;
  ulong uVar4;
  int __fd;
  QSinglePointEvent *in_RSI;
  QSinglePointEvent *pQVar5;
  undefined1 **ppuVar6;
  QEvent *pQVar7;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWhatsThisClickedEvent e_1;
  QString href;
  QString a;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined7 in_stack_ffffffffffffff18;
  byte bVar8;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  uint uVar9;
  QWhatsThisClickedEvent local_c0 [40];
  QString local_98;
  QPointF local_78;
  QPoint local_68;
  QPoint local_60;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QPointF local_30;
  QPoint local_20;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)in_RDI[1].super_QPaintDevice & 1) == 0) goto LAB_004c34a0;
  pQVar5 = in_RSI;
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x4c3209);
  __fd = (int)pQVar5;
  bVar8 = 0;
  if (bVar1) {
    MVar2 = QSinglePointEvent::button(in_RSI);
    bVar8 = 0;
    if ((MVar2 == LeftButton) && (bVar8 = 0, *(qreal *)&in_RDI[2].field_0x8 != 0.0)) {
      local_18 = QWidget::rect((QWidget *)
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      local_30 = QSinglePointEvent::position((QSinglePointEvent *)0x4c3268);
      local_20 = QPointF::toPoint((QPointF *)in_RDI);
      __fd = (int)&local_20;
      bVar8 = QRect::contains((QPoint *)&local_18,SUB81(&local_20,0));
    }
  }
  if ((bVar8 & 1) != 0) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QPointF *)QTextDocument::documentLayout();
    local_78 = QSinglePointEvent::position((QSinglePointEvent *)0x4c3301);
    local_68 = QPointF::toPoint((QPointF *)in_RDI);
    QPoint::QPoint((QPoint *)this_00,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
    local_60 = ::operator-((QPoint *)in_RDI,(QPoint *)CONCAT17(bVar8,in_stack_ffffffffffffff18));
    QPointF::QPointF(this_00,(QPoint *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                    );
    QAbstractTextDocumentLayout::anchorAt((QPointF *)&local_48);
    local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x4c33b3);
    __fd = (int)&local_48;
    bVar1 = ::operator==((QString *)this_00,
                         (QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (bVar1) {
      ppuVar6 = &local_48;
      QString::operator=(&local_98,(QString *)ppuVar6);
      __fd = (int)ppuVar6;
    }
    QString::clear((QString *)this_00);
    bVar1 = QString::isEmpty((QString *)0x4c33f9);
    if (bVar1) {
LAB_004c3469:
      uVar9 = 0;
    }
    else {
      memset(local_c0,0xaa,0x28);
      QWhatsThisClickedEvent::QWhatsThisClickedEvent(local_c0,(QString *)&local_98);
      pQVar3 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x4c342e);
      pQVar7 = (QEvent *)local_c0;
      uVar4 = QCoreApplication::sendEvent(&pQVar3->super_QObject,pQVar7);
      __fd = (int)pQVar7;
      uVar9 = (uint)((uVar4 & 1) != 0);
      QWhatsThisClickedEvent::~QWhatsThisClickedEvent(local_c0);
      if (uVar9 == 0) goto LAB_004c3469;
    }
    QString::~QString((QString *)0x4c347b);
    QString::~QString((QString *)0x4c3488);
    if (uVar9 != 0) goto LAB_004c34a0;
  }
  QWidget::close(in_RDI,__fd);
LAB_004c34a0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWhatsThat::mouseReleaseEvent(QMouseEvent* e)
{
    if (!pressed)
        return;
    if (widget && e->button() == Qt::LeftButton && doc && rect().contains(e->position().toPoint())) {
        QString a = doc->documentLayout()->anchorAt(e->position().toPoint() -  QPoint(hMargin, vMargin));
        QString href;
        if (anchor == a)
            href = a;
        anchor.clear();
        if (!href.isEmpty()) {
            QWhatsThisClickedEvent e(href);
            if (QCoreApplication::sendEvent(widget, &e))
                return;
        }
    }
    close();
}